

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# motion_derivative.cpp
# Opt level: O3

AffineSpace3fa * __thiscall
embree::motion_derivative_regression_test::random_quaternion_decomposition
          (AffineSpace3fa *__return_storage_ptr__,motion_derivative_regression_test *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined4 extraout_EAX;
  uint uVar3;
  _Adaptor<std::mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>,_float>
  __aurng;
  mt19937_64 *__urng;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float extraout_XMM0_Db;
  float fVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  float fVar22;
  float fVar23;
  float fVar24;
  
  __urng = &this->rng;
  fVar4 = std::
          generate_canonical<float,24ul,std::mersenne_twister_engine<unsigned_long,64ul,312ul,156ul,31ul,13043109905998158313ul,29ul,6148914691236517205ul,17ul,8202884508482404352ul,37ul,18444473444759240704ul,43ul,6364136223846793005ul>>
                    (__urng);
  fVar5 = std::
          generate_canonical<float,24ul,std::mersenne_twister_engine<unsigned_long,64ul,312ul,156ul,31ul,13043109905998158313ul,29ul,6148914691236517205ul,17ul,8202884508482404352ul,37ul,18444473444759240704ul,43ul,6364136223846793005ul>>
                    (__urng);
  fVar6 = std::
          generate_canonical<float,24ul,std::mersenne_twister_engine<unsigned_long,64ul,312ul,156ul,31ul,13043109905998158313ul,29ul,6148914691236517205ul,17ul,8202884508482404352ul,37ul,18444473444759240704ul,43ul,6364136223846793005ul>>
                    (__urng);
  fVar7 = std::
          generate_canonical<float,24ul,std::mersenne_twister_engine<unsigned_long,64ul,312ul,156ul,31ul,13043109905998158313ul,29ul,6148914691236517205ul,17ul,8202884508482404352ul,37ul,18444473444759240704ul,43ul,6364136223846793005ul>>
                    (__urng);
  fVar8 = std::
          generate_canonical<float,24ul,std::mersenne_twister_engine<unsigned_long,64ul,312ul,156ul,31ul,13043109905998158313ul,29ul,6148914691236517205ul,17ul,8202884508482404352ul,37ul,18444473444759240704ul,43ul,6364136223846793005ul>>
                    (__urng);
  fVar24 = fVar7 + 0.0 + fVar7 + 0.0 + -1.0;
  fVar8 = fVar8 + 0.0 + fVar8 + 0.0 + -1.0;
  fVar7 = 0.0;
  if (fVar24 * fVar24 + fVar8 * fVar8 <= 0.995) {
    fVar7 = (1.0 - fVar24 * fVar24) - fVar8 * fVar8;
    if (fVar7 < 0.0) {
      fVar7 = sqrtf(fVar7);
    }
    else {
      fVar7 = SQRT(fVar7);
    }
  }
  fVar22 = fVar8 * fVar8;
  fVar23 = fVar7 * fVar7;
  fVar9 = fVar22 + fVar24 * fVar24 + fVar23;
  fVar18 = fVar22 + fVar22 + 0.0;
  fVar23 = fVar22 + fVar23 + fVar23;
  fVar22 = fVar22 + 0.0 + 0.0;
  auVar19._4_4_ = fVar18;
  auVar19._0_4_ = fVar9;
  auVar19._8_4_ = fVar23;
  auVar19._12_4_ = fVar22;
  auVar20._4_4_ = fVar18;
  auVar20._0_4_ = fVar9;
  auVar20._8_4_ = fVar23;
  auVar20._12_4_ = fVar22;
  auVar20 = rsqrtss(auVar19,auVar20);
  fVar18 = auVar20._0_4_;
  fVar22 = fVar18 * 1.5 - fVar18 * fVar18 * fVar9 * 0.5 * fVar18;
  fVar24 = fVar22 * fVar24;
  fVar8 = fVar22 * fVar8;
  fVar7 = fVar22 * fVar7;
  fVar22 = fVar22 * (extraout_XMM0_Db + 0.0 + extraout_XMM0_Db + 0.0 + 0.0);
  fVar9 = std::
          generate_canonical<float,24ul,std::mersenne_twister_engine<unsigned_long,64ul,312ul,156ul,31ul,13043109905998158313ul,29ul,6148914691236517205ul,17ul,8202884508482404352ul,37ul,18444473444759240704ul,43ul,6364136223846793005ul>>
                    (__urng);
  fVar9 = ((fVar9 + 0.0) * 12.566371 + -6.2831855) * 0.5;
  fVar18 = cosf(fVar9);
  fVar9 = sinf(fVar9);
  fVar23 = fVar24 * fVar24 + fVar8 * fVar8 + fVar7 * fVar7;
  auVar21._4_4_ = fVar8;
  auVar21._0_4_ = fVar23;
  auVar21._8_4_ = fVar7;
  auVar21._12_4_ = fVar22;
  auVar1._4_4_ = fVar8;
  auVar1._0_4_ = fVar23;
  auVar1._8_4_ = fVar7;
  auVar1._12_4_ = fVar22;
  auVar20 = rsqrtss(auVar21,auVar1);
  fVar22 = auVar20._0_4_;
  fVar23 = fVar22 * 1.5 - fVar22 * fVar22 * fVar23 * 0.5 * fVar22;
  fVar22 = std::
           generate_canonical<float,24ul,std::mersenne_twister_engine<unsigned_long,64ul,312ul,156ul,31ul,13043109905998158313ul,29ul,6148914691236517205ul,17ul,8202884508482404352ul,37ul,18444473444759240704ul,43ul,6364136223846793005ul>>
                     (__urng);
  fVar10 = std::
           generate_canonical<float,24ul,std::mersenne_twister_engine<unsigned_long,64ul,312ul,156ul,31ul,13043109905998158313ul,29ul,6148914691236517205ul,17ul,8202884508482404352ul,37ul,18444473444759240704ul,43ul,6364136223846793005ul>>
                     (__urng);
  fVar11 = std::
           generate_canonical<float,24ul,std::mersenne_twister_engine<unsigned_long,64ul,312ul,156ul,31ul,13043109905998158313ul,29ul,6148914691236517205ul,17ul,8202884508482404352ul,37ul,18444473444759240704ul,43ul,6364136223846793005ul>>
                     (__urng);
  fVar12 = std::
           generate_canonical<float,24ul,std::mersenne_twister_engine<unsigned_long,64ul,312ul,156ul,31ul,13043109905998158313ul,29ul,6148914691236517205ul,17ul,8202884508482404352ul,37ul,18444473444759240704ul,43ul,6364136223846793005ul>>
                     (__urng);
  fVar13 = std::
           generate_canonical<float,24ul,std::mersenne_twister_engine<unsigned_long,64ul,312ul,156ul,31ul,13043109905998158313ul,29ul,6148914691236517205ul,17ul,8202884508482404352ul,37ul,18444473444759240704ul,43ul,6364136223846793005ul>>
                     (__urng);
  fVar13 = (fVar13 + 0.0) * 20.0 + -10.0;
  fVar12 = (fVar12 + 0.0) * 20.0 + -10.0;
  fVar13 = (float)((uint)(fVar13 + -0.001) & -(uint)(fVar13 < 0.0) |
                  ~-(uint)(fVar13 < 0.0) & (uint)fVar13);
  fVar12 = (float)((uint)(fVar12 + -0.001) & -(uint)(fVar12 < 0.0) |
                  ~-(uint)(fVar12 < 0.0) & (uint)fVar12);
  auVar2._4_4_ = -(uint)(fVar13 < 0.0);
  auVar2._0_4_ = -(uint)(fVar13 < 0.0);
  auVar2._8_4_ = -(uint)(fVar12 < 0.0);
  auVar2._12_4_ = -(uint)(fVar12 < 0.0);
  uVar3 = movmskpd(extraout_EAX,auVar2);
  if ((uVar3 & 2) == 0) {
    fVar12 = fVar12 + 0.001;
  }
  if ((uVar3 & 1) == 0) {
    fVar13 = fVar13 + 0.001;
  }
  fVar14 = std::
           generate_canonical<float,24ul,std::mersenne_twister_engine<unsigned_long,64ul,312ul,156ul,31ul,13043109905998158313ul,29ul,6148914691236517205ul,17ul,8202884508482404352ul,37ul,18444473444759240704ul,43ul,6364136223846793005ul>>
                     (__urng);
  fVar14 = (fVar14 + 0.0) * 20.0 + -10.0;
  fVar14 = (float)(~-(uint)(fVar14 < 0.0) & (uint)fVar14 |
                  (uint)(fVar14 + -0.001) & -(uint)(fVar14 < 0.0));
  fVar15 = std::
           generate_canonical<float,24ul,std::mersenne_twister_engine<unsigned_long,64ul,312ul,156ul,31ul,13043109905998158313ul,29ul,6148914691236517205ul,17ul,8202884508482404352ul,37ul,18444473444759240704ul,43ul,6364136223846793005ul>>
                     (__urng);
  fVar16 = std::
           generate_canonical<float,24ul,std::mersenne_twister_engine<unsigned_long,64ul,312ul,156ul,31ul,13043109905998158313ul,29ul,6148914691236517205ul,17ul,8202884508482404352ul,37ul,18444473444759240704ul,43ul,6364136223846793005ul>>
                     (__urng);
  fVar17 = std::
           generate_canonical<float,24ul,std::mersenne_twister_engine<unsigned_long,64ul,312ul,156ul,31ul,13043109905998158313ul,29ul,6148914691236517205ul,17ul,8202884508482404352ul,37ul,18444473444759240704ul,43ul,6364136223846793005ul>>
                     (__urng);
  (__return_storage_ptr__->l).vx.field_0.m128[0] = fVar12;
  (__return_storage_ptr__->l).vx.field_0.m128[1] = (fVar4 + 0.0) * 20.0 + -10.0;
  (__return_storage_ptr__->l).vx.field_0.m128[2] = (fVar5 + 0.0) * 20.0 + -10.0;
  (__return_storage_ptr__->l).vx.field_0.m128[3] = fVar24 * fVar23 * fVar9;
  *(ulong *)&(__return_storage_ptr__->l).vy.field_0 =
       CONCAT44(fVar13,fVar15 + 0.0 + fVar15 + 0.0 + -1.0);
  *(ulong *)((long)&(__return_storage_ptr__->l).vy.field_0 + 8) =
       CONCAT44(fVar8 * fVar23 * fVar9,(fVar6 + 0.0) * 20.0 + -10.0);
  (__return_storage_ptr__->l).vz.field_0.m128[0] = fVar16 + 0.0 + fVar16 + 0.0 + -1.0;
  (__return_storage_ptr__->l).vz.field_0.m128[1] = fVar17 + 0.0 + fVar17 + 0.0 + -1.0;
  (__return_storage_ptr__->l).vz.field_0.m128[2] =
       (float)(~-(uint)(fVar14 < 0.0) & (uint)(fVar14 + 0.001) |
              -(uint)(fVar14 < 0.0) & (uint)fVar14);
  (__return_storage_ptr__->l).vz.field_0.m128[3] = fVar23 * fVar7 * fVar9;
  (__return_storage_ptr__->p).field_0.m128[0] = (fVar22 + 0.0) * 20.0 + -10.0;
  (__return_storage_ptr__->p).field_0.m128[1] = (fVar10 + 0.0) * 20.0 + -10.0;
  (__return_storage_ptr__->p).field_0.m128[2] = (fVar11 + 0.0) * 20.0 + -10.0;
  (__return_storage_ptr__->p).field_0.m128[3] = fVar18;
  return __return_storage_ptr__;
}

Assistant:

inline AffineSpace3fa random_quaternion_decomposition()
    {
      Vec3fa T(20.f * rand01() - 10.f, 20.f * rand01() - 10.f, 20.f * rand01() - 10.f);
      Quaternion3f q = Quaternion3f::rotate(random_axis(), 4.f * M_PI * rand01() - 2.f * M_PI);
      AffineSpace3fa S(one);
      S.p = Vec3fa(20.f * rand01() - 10.f, 20.f * rand01() - 10.f, 20.f * rand01() - 10.f);
      S.l.vx.x = random_scale();
      S.l.vy.y = random_scale();
      S.l.vz.z = random_scale();
      S.l.vy.x = 2.f * rand01() - 1.f;
      S.l.vz.x = 2.f * rand01() - 1.f;
      S.l.vz.y = 2.f * rand01() - 1.f;
      return quaternionDecomposition(T, q, S);
    }